

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

int getMicroSecondTimeout(timeval *timeout)

{
  int iVar1;
  long lVar2;
  ssize_t sznum;
  timeval tVar3;
  
  tVar3 = tutil_tvnow();
  lVar2 = (timeout->tv_usec - tVar3.tv_usec) + (timeout->tv_sec - tVar3.tv_sec) * 1000000;
  sznum = 0;
  if (0 < lVar2) {
    sznum = lVar2;
  }
  iVar1 = curlx_sztosi(sznum);
  return iVar1;
}

Assistant:

static int getMicroSecondTimeout(struct timeval* timeout)
{
  struct timeval now;
  ssize_t result;
  now = tutil_tvnow();
  result = (ssize_t)((timeout->tv_sec - now.tv_sec) * 1000000 +
    timeout->tv_usec - now.tv_usec);
  if(result < 0)
    result = 0;

  return curlx_sztosi(result);
}